

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache_test.cpp
# Opt level: O2

void __thiscall BufferCache_Basics_Test::TestBody(BufferCache_Basics_Test *this)

{
  pointer *this_00;
  size_t i;
  ulong uVar1;
  char *pcVar2;
  char *in_R9;
  long lVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertionResult gtest_ar_5;
  int *ptr2;
  int *ptr;
  vector<int,_std::allocator<int>_> v2;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  vector<int,_std::allocator<int>_> v;
  
  this_00 = &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         pbrt::intBufferCache != (BufferCache<int> *)0x0);
  if (pbrt::intBufferCache == (BufferCache<int> *)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&v,(internal *)&v2,(AssertionResult *)"intBufferCache == nullptr","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ptr,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
               ,0xf,(char *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
    std::__cxx11::string::~string((string *)&v);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 5;
    v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x200000001;
    v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x400000003;
    __l._M_len = 5;
    __l._M_array = (iterator)&v2;
    std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&gtest_ar_5);
    ptr = (int *)((ulong)ptr._4_4_ << 0x20);
    gtest_ar_5._0_8_ = pbrt::intBufferCache->bytesUsed;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&v2,"0","intBufferCache->BytesUsed()",(int *)&ptr,
               (unsigned_long *)&gtest_ar_5);
    if ((char)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == '\0') {
      testing::Message::Message((Message *)&gtest_ar_5);
      if (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
          == (pointer)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ptr,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x13,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish);
    ptr = pbrt::BufferCache<int>::LookupOrAdd(pbrt::intBufferCache,&v);
    lVar3 = 0;
    for (uVar1 = 0;
        uVar1 < (ulong)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&v2,"ptr[i]","v[i]",(int *)((long)ptr + lVar3),
                 (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3));
      if ((char)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == '\0') {
        testing::Message::Message((Message *)&gtest_ar_5);
        pcVar2 = "";
        if (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish != (pointer)0x0) {
          pcVar2 = *(char **)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ptr2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                   ,0x17,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&ptr2,(Message *)&gtest_ar_5);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr2);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_5);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
      lVar3 = lVar3 + 4;
    }
    gtest_ar_5.success_ = true;
    gtest_ar_5._1_7_ = 0;
    ptr2 = (int *)pbrt::intBufferCache->bytesUsed;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&v2,"5 * sizeof(int)","intBufferCache->BytesUsed()",
               (unsigned_long *)&gtest_ar_5,(unsigned_long *)&ptr2);
    if ((char)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == '\0') {
      testing::Message::Message((Message *)&gtest_ar_5);
      if (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
          == (pointer)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ptr2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x19,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ptr2,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish);
    gtest_ar_5._0_8_ = pbrt::BufferCache<int>::LookupOrAdd(pbrt::intBufferCache,&v);
    testing::internal::CmpHelperEQ<int_const*,int_const*>
              ((internal *)&v2,"ptr","intBufferCache->LookupOrAdd(v)",&ptr,(int **)&gtest_ar_5);
    if ((char)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == '\0') {
      testing::Message::Message((Message *)&gtest_ar_5);
      if (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
          == (pointer)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ptr2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x1b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ptr2,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish);
    gtest_ar_5.success_ = true;
    gtest_ar_5._1_7_ = 0;
    ptr2 = (int *)pbrt::intBufferCache->bytesUsed;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&v2,"5 * sizeof(int)","intBufferCache->BytesUsed()",
               (unsigned_long *)&gtest_ar_5,(unsigned_long *)&ptr2);
    if ((char)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == '\0') {
      testing::Message::Message((Message *)&gtest_ar_5);
      if (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
          == (pointer)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ptr2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x1d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&ptr2,(Message *)&gtest_ar_5);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_5);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish);
    gtest_ar_5.success_ = true;
    gtest_ar_5._1_7_ = 0x2000000;
    gtest_ar_5.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000003;
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)&gtest_ar_5;
    std::vector<int,_std::allocator<int>_>::vector(&v2,__l_00,(allocator_type *)&ptr2);
    ptr2 = pbrt::BufferCache<int>::LookupOrAdd(pbrt::intBufferCache,&v2);
    testing::internal::CmpHelperNE<int_const*,int_const*>
              ((internal *)&gtest_ar_5,"ptr","ptr2",&ptr,&ptr2);
    if (gtest_ar_5.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      if (gtest_ar_5.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x21,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_58);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_5.message_);
    lVar3 = 0;
    for (uVar1 = 0;
        uVar1 < (ulong)((long)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_5,"ptr2[i]","v2[i]",(int *)((long)ptr2 + lVar3),
                 (int *)((long)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3));
      if (gtest_ar_5.success_ == false) {
        testing::Message::Message((Message *)&local_58);
        pcVar2 = "";
        if (gtest_ar_5.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                   ,0x23,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_58);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_5.message_);
      lVar3 = lVar3 + 4;
    }
    local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x24;
    local_60.data_ = (AssertHelperData *)pbrt::intBufferCache->bytesUsed;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_5,"9 * sizeof(int)","intBufferCache->BytesUsed()",
               (unsigned_long *)&local_58,(unsigned_long *)&local_60);
    if (gtest_ar_5.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      if (gtest_ar_5.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x25,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_58);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_5.message_);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&v2.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&v.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

TEST(BufferCache, Basics) {
    ASSERT_FALSE(intBufferCache == nullptr);

    std::vector<int> v{1,2,3,4,5};

    EXPECT_EQ(0, intBufferCache->BytesUsed());

    const int *ptr = intBufferCache->LookupOrAdd(v);
    for (size_t i = 0; i < v.size(); ++i)
        EXPECT_EQ(ptr[i], v[i]);

    EXPECT_EQ(5 * sizeof(int), intBufferCache->BytesUsed());

    EXPECT_EQ(ptr, intBufferCache->LookupOrAdd(v));

    EXPECT_EQ(5 * sizeof(int), intBufferCache->BytesUsed());

    std::vector<int> v2{1,2,3,4};
    const int *ptr2 = intBufferCache->LookupOrAdd(v2);
    EXPECT_NE(ptr, ptr2);
    for (size_t i = 0; i < v2.size(); ++i)
        EXPECT_EQ(ptr2[i], v2[i]);

    EXPECT_EQ(9 * sizeof(int), intBufferCache->BytesUsed());
}